

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

void __thiscall hwnet::Buffer::Buffer(Buffer *this,size_t cap_,size_t l)

{
  ulong uVar1;
  __shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2> local_38;
  ulong local_28;
  size_t cap__local;
  
  this->b = 0;
  this->len = 0;
  (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28 = cap_;
  if (cap_ < 0x10) {
    local_28 = 0x10;
  }
  uVar1 = local_28;
  std::make_shared<hwnet::Buffer::bytes,unsigned_long&>((unsigned_long *)&local_38);
  if (uVar1 < l) {
    l = uVar1;
  }
  std::__shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2> *)this,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  this->cap = local_28;
  this->len = l;
  return;
}

Assistant:

Buffer(size_t cap_,size_t l):b(0),len(0){
		if(cap_ < 16) {
			cap_ = 16;
		}
		
		if(l > cap_) {
			l = cap_;
		}

		this->buff = std::make_shared<bytes>(cap_);
		this->cap  = cap_;
		this->len  = l;
	}